

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Routing.cpp
# Opt level: O1

void RoutingDemo_GetData(int target,float *data,int numsamples,int numchannels)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  float *pfVar10;
  
  if ((uint)target < 0x10) {
    uVar6 = (ulong)(uint)target;
    iVar1 = *(int *)(Routing::bufferchannels + uVar6 * 4);
    iVar5 = iVar1 - numchannels;
    if (iVar1 - numchannels < 1) {
      iVar5 = 0;
    }
    if (0 < numsamples) {
      piVar7 = &Routing::buffer + uVar6 * 0x10002;
      iVar2 = iVar1;
      if (numchannels < iVar1) {
        iVar2 = numchannels;
      }
      uVar8 = 0;
      pfVar10 = data;
      do {
        if (0 < numchannels) {
          uVar9 = 0;
          do {
            iVar4 = *piVar7;
            if (iVar4 != *(int *)(&DAT_00437384 + uVar6 * 0x40008)) {
              iVar3 = iVar4 + 1;
              if (iVar4 == 0xffff) {
                iVar3 = 0;
              }
              pfVar10[uVar9] = *(float *)(&DAT_00437388 + (long)iVar3 * 4 + uVar6 * 0x40008);
              *piVar7 = iVar3;
            }
            uVar9 = uVar9 + 1;
          } while ((uint)numchannels != uVar9);
        }
        iVar3 = iVar5 + *piVar7;
        iVar4 = *piVar7 + -0x10000 + iVar5;
        if (iVar3 < 0x10000) {
          iVar4 = iVar3;
        }
        *piVar7 = iVar4;
        uVar9 = (ulong)(uint)(numchannels - iVar1);
        iVar4 = iVar2;
        if (0 < numchannels - iVar1) {
          do {
            data[iVar4] = 0.0;
            iVar4 = iVar4 + 1;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
        uVar8 = uVar8 + 1;
        pfVar10 = pfVar10 + (uint)numchannels;
        iVar2 = iVar2 + numchannels;
      } while (uVar8 != (uint)numsamples);
    }
  }
  return;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API void RoutingDemo_GetData(int target, float* data, int numsamples, int numchannels)
{
    if (target < 0 || target >= Routing::MAXINDEX)
        return;
    int skipchannels = Routing::bufferchannels[target] - numchannels; if (skipchannels < 0)
        skipchannels = 0;
    int zerochannels = numchannels - Routing::bufferchannels[target]; if (zerochannels < 0)
        zerochannels = 0;
    for (int n = 0; n < numsamples; n++)
    {
        for (int i = 0; i < numchannels; i++)
            Routing::buffer[target].Read(data[n * numchannels + i]);
        Routing::buffer[target].Skip(skipchannels);
        for (int i = 0; i < zerochannels; i++)
            data[n * numchannels + i + numchannels - zerochannels] = 0.0f;
    }
}